

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  int iVar1;
  Tokenizer *pTVar2;
  pointer pcVar3;
  Rep *pRVar4;
  ulong uVar5;
  ErrorCollector *pEVar6;
  bool bVar7;
  bool bVar8;
  FieldDescriptorProto *pFVar9;
  undefined8 *puVar10;
  bool bVar11;
  LocationRecorder location;
  string extendee;
  Token extendee_end;
  Token extendee_start;
  LocationRecorder extendee_location;
  undefined1 local_f8 [32];
  string local_d8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a0 [24];
  ColumnNumber local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [24];
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  bVar7 = Consume(this,"extend");
  if (bVar7) {
    pTVar2 = this->input_;
    local_80._0_4_ = (pTVar2->current_).type;
    local_78._M_p = local_68;
    pcVar3 = (pTVar2->current_).text._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + (pTVar2->current_).text._M_string_length);
    local_50 = (pTVar2->current_).end_column;
    local_68._16_4_ = (pTVar2->current_).line;
    local_68._20_4_ = (pTVar2->current_).column;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    bVar7 = ParseUserDefinedType(this,&local_d8);
    if (bVar7) {
      pTVar2 = this->input_;
      local_b8._0_4_ = (pTVar2->previous_).type;
      local_b0._M_p = local_a0;
      pcVar3 = (pTVar2->previous_).text._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_b8 + 8),pcVar3,pcVar3 + (pTVar2->previous_).text._M_string_length)
      ;
      local_88 = (pTVar2->previous_).end_column;
      local_a0._16_4_ = (pTVar2->previous_).line;
      local_a0._20_4_ = (pTVar2->previous_).column;
      bVar7 = ConsumeEndOfDeclaration(this,"{",extend_location);
      if (bVar7) {
        bVar8 = true;
        do {
          bVar11 = (this->input_->current_).type == TYPE_END;
          bVar7 = !bVar11;
          if (bVar11) {
            local_f8._0_8_ = (Parser *)(local_f8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,
                       "Reached end of input in extend definition (missing \'}\').","");
            pEVar6 = this->error_collector_;
            if (pEVar6 != (ErrorCollector *)0x0) {
              (*pEVar6->_vptr_ErrorCollector[2])
                        (pEVar6,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,local_f8);
            }
            this->had_errors_ = true;
            if ((Parser *)local_f8._0_8_ != (Parser *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_);
            }
            break;
          }
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_f8,extend_location,
                     (extensions->super_RepeatedPtrFieldBase).current_size_);
          pRVar4 = (extensions->super_RepeatedPtrFieldBase).rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_00341ae1:
            pFVar9 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               ((extensions->super_RepeatedPtrFieldBase).arena_);
            pFVar9 = (FieldDescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                               (&extensions->super_RepeatedPtrFieldBase,pFVar9);
          }
          else {
            iVar1 = (extensions->super_RepeatedPtrFieldBase).current_size_;
            if (pRVar4->allocated_size <= iVar1) goto LAB_00341ae1;
            (extensions->super_RepeatedPtrFieldBase).current_size_ = iVar1 + 1;
            pFVar9 = (FieldDescriptorProto *)pRVar4->elements[iVar1];
          }
          LocationRecorder::LocationRecorder(&local_48,(LocationRecorder *)local_f8,2);
          LocationRecorder::StartAt(&local_48,(Token *)local_80);
          LocationRecorder::EndAt(&local_48,(Token *)local_b8);
          if (bVar8) {
            LocationRecorder::RecordLegacyLocation(&local_48,&pFVar9->super_Message,EXTENDEE);
            bVar8 = false;
          }
          LocationRecorder::~LocationRecorder(&local_48);
          *(byte *)(pFVar9->_has_bits_).has_bits_ = (byte)(pFVar9->_has_bits_).has_bits_[0] | 2;
          uVar5 = (pFVar9->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar10 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            puVar10 = (undefined8 *)*puVar10;
          }
          internal::ArenaStringPtr::Set(&pFVar9->extendee_,&local_d8,puVar10);
          bVar11 = ParseMessageField(this,pFVar9,messages,parent_location,
                                     location_field_number_for_nested_type,
                                     (LocationRecorder *)local_f8,containing_file);
          if (!bVar11) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_f8);
          bVar11 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
        } while (!bVar11);
      }
      else {
        bVar7 = false;
      }
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  std::string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      AddError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type, location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}